

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O3

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_xop
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  undefined1 auVar16 [16];
  int *piVar17;
  int iVar18;
  void *pvVar19;
  ulong uVar20;
  long lVar21;
  void *pvVar22;
  ulong uVar23;
  long lVar24;
  void *pvVar25;
  uint *puVar26;
  long lVar27;
  undefined4 uVar28;
  void *pvVar29;
  long lVar30;
  void *pvVar31;
  undefined2 *puVar32;
  void *pvVar33;
  undefined2 *puVar34;
  void *pvVar35;
  long lVar36;
  long lVar37;
  undefined2 *puVar38;
  undefined2 *puVar39;
  int k;
  void *pvVar40;
  short tmp [6] [3];
  long local_180;
  void *local_178;
  void *local_170;
  void *local_160;
  void *local_158;
  void *local_150;
  void *local_148;
  void *local_140;
  void *local_138;
  undefined1 local_108 [64];
  size_t local_c8;
  long local_c0;
  long local_b8;
  void *local_b0;
  ulong local_a8;
  void *local_a0;
  void *local_98;
  void *local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  undefined8 local_60;
  short sStack_58;
  uint auStack_56 [9];
  
  uVar23 = (ulong)(uint)outch;
  local_c8 = 0;
  local_108._0_8_ = (void *)0x0;
  local_108._8_4_ = 0;
  local_108._12_4_ = 0;
  local_108._16_8_ = 0;
  local_108._24_4_ = 0;
  local_108._32_8_ = (Allocator *)0x0;
  local_108._40_4_ = 0;
  local_108._44_4_ = 0;
  local_108._48_12_ = SUB1612((undefined1  [16])0x0,4);
  Mat::create((Mat *)local_108,0x24,inch,outch,2,(Allocator *)0x0);
  if (0 < outch) {
    pvVar22 = kernel->data;
    local_160 = (void *)local_108._0_8_;
    local_178 = (void *)0x0;
    do {
      if (0 < inch) {
        iVar18 = inch * 9 * (int)local_178;
        uVar20 = 0;
        pvVar25 = local_160;
        do {
          lVar24 = uVar20 * 9;
          cVar1 = *(char *)((long)pvVar22 + lVar24 + iVar18);
          cVar2 = *(char *)((long)pvVar22 + lVar24 + (long)iVar18 + 1);
          cVar3 = *(char *)((long)pvVar22 + lVar24 + (long)iVar18 + 2);
          cVar4 = *(char *)((long)pvVar22 + lVar24 + (long)iVar18 + 3);
          cVar5 = *(char *)((long)pvVar22 + lVar24 + (long)iVar18 + 4);
          cVar6 = *(char *)((long)pvVar22 + lVar24 + (long)iVar18 + 5);
          cVar7 = *(char *)((long)pvVar22 + lVar24 + (long)iVar18 + 6);
          cVar8 = *(char *)((long)pvVar22 + lVar24 + (long)iVar18 + 7);
          cVar9 = *(char *)((long)pvVar22 + lVar24 + (long)iVar18 + 8);
          lVar24 = 4;
          do {
            sVar10 = *(short *)(&UNK_005320ec + lVar24);
            sVar11 = *(short *)(&UNK_005320ee + lVar24);
            sVar12 = *(short *)((long)&DAT_005320f0 + lVar24);
            *(short *)((long)&local_60 + lVar24 + 4) =
                 sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1;
            *(short *)((long)&local_60 + lVar24 + 6) =
                 sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
            *(short *)((long)auStack_56 + lVar24 + -2) =
                 sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
            lVar24 = lVar24 + 6;
          } while (lVar24 != 0x28);
          lVar24 = 0;
          pvVar19 = pvVar25;
          do {
            sVar10 = *(short *)((long)auStack_56 + lVar24 * 6 + -2);
            uVar13 = *(uint *)((long)auStack_56 + lVar24 * 6);
            puVar26 = &DAT_005320f2;
            lVar27 = 0;
            do {
              auVar16 = vpmullw_avx(ZEXT416(*puVar26),ZEXT416(uVar13));
              uVar28 = vpextrw_avx(auVar16,1);
              *(short *)((long)pvVar19 + lVar27 * 2) =
                   (short)uVar28 + auVar16._0_2_ + *(short *)((long)puVar26 + -2) * sVar10;
              lVar27 = lVar27 + 1;
              puVar26 = (uint *)((long)puVar26 + 6);
            } while (lVar27 != 6);
            lVar24 = lVar24 + 1;
            pvVar19 = (void *)((long)pvVar19 + 0xc);
          } while (lVar24 != 6);
          uVar20 = uVar20 + 1;
          pvVar25 = (void *)((long)pvVar25 + (long)(int)local_108._44_4_ * local_108._16_8_);
        } while (uVar20 != (uint)inch);
      }
      local_178 = (void *)((long)local_178 + 1);
      local_160 = (void *)((long)local_160 + local_c8 * local_108._16_8_);
    } while (local_178 != (void *)uVar23);
  }
  iVar18 = outch + 3;
  if (-1 < outch) {
    iVar18 = outch;
  }
  Mat::create(kernel_tm,inch,0x24,outch + (iVar18 >> 2) * -3,8,4,(Allocator *)0x0);
  uVar20 = 0;
  if (3 < outch) {
    lVar27 = (long)(int)local_108._44_4_;
    lVar30 = local_108._16_8_ * local_c8;
    local_b0 = kernel_tm->data;
    local_b8 = kernel_tm->cstep * kernel_tm->elemsize;
    local_60 = (long)kernel_tm->w * kernel_tm->elemsize;
    lVar36 = local_108._16_8_ * lVar27;
    local_c0 = lVar30 * 4;
    lVar24 = lVar36 * 8;
    pvVar22 = (void *)((local_c8 * 3 + lVar27) * local_108._16_8_ + local_108._0_8_);
    uVar20 = 0;
    pvVar25 = (void *)((lVar27 + local_c8 * 2) * local_108._16_8_ + local_108._0_8_);
    pvVar19 = (void *)(local_108._0_8_ + lVar30 * 2);
    pvVar29 = (void *)local_108._0_8_;
    pvVar31 = (void *)((local_c8 + lVar27) * local_108._16_8_ + local_108._0_8_);
    pvVar33 = (void *)(lVar30 + local_108._0_8_);
    pvVar35 = (void *)(local_108._0_8_ + lVar36);
    pvVar40 = (void *)(lVar30 * 3 + local_108._0_8_);
    do {
      local_98 = pvVar40;
      local_90 = pvVar35;
      local_78 = pvVar33;
      local_70 = pvVar31;
      local_68 = pvVar29;
      local_a0 = pvVar19;
      local_88 = pvVar25;
      local_a8 = uVar20;
      local_80 = pvVar22;
      local_180 = 0;
      local_178 = local_90;
      local_170 = local_68;
      local_160 = local_70;
      local_158 = local_80;
      local_150 = local_88;
      local_148 = local_98;
      local_140 = local_a0;
      local_138 = local_78;
      do {
        if (7 < inch) {
          lVar30 = (long)local_b0 + local_60 * local_180 + (local_a8 >> 2) * local_b8;
          pvVar22 = local_138;
          lVar27 = 0;
          pvVar25 = local_158;
          pvVar19 = local_170;
          pvVar29 = local_148;
          pvVar31 = local_140;
          pvVar33 = local_150;
          pvVar35 = local_160;
          pvVar40 = local_178;
          do {
            lVar21 = 0;
            lVar37 = 0;
            do {
              *(undefined2 *)(lVar30 + lVar37) = *(undefined2 *)((long)pvVar19 + lVar21);
              *(undefined2 *)(lVar30 + lVar37 + 2) = *(undefined2 *)((long)pvVar40 + lVar21);
              *(undefined2 *)(lVar30 + lVar37 + 4) = *(undefined2 *)((long)pvVar22 + lVar21);
              *(undefined2 *)(lVar30 + lVar37 + 6) = *(undefined2 *)((long)pvVar35 + lVar21);
              *(undefined2 *)(lVar30 + lVar37 + 8) = *(undefined2 *)((long)pvVar31 + lVar21);
              *(undefined2 *)(lVar30 + lVar37 + 10) = *(undefined2 *)((long)pvVar33 + lVar21);
              *(undefined2 *)(lVar30 + lVar37 + 0xc) = *(undefined2 *)((long)pvVar29 + lVar21);
              *(undefined2 *)(lVar30 + lVar37 + 0xe) = *(undefined2 *)((long)pvVar25 + lVar21);
              lVar37 = lVar37 + 0x10;
              lVar21 = lVar21 + lVar36 * 2;
            } while (lVar37 != 0x40);
            lVar21 = lVar27 + 0xf;
            pvVar25 = (void *)((long)pvVar25 + lVar24);
            pvVar33 = (void *)((long)pvVar33 + lVar24);
            pvVar35 = (void *)((long)pvVar35 + lVar24);
            pvVar40 = (void *)((long)pvVar40 + lVar24);
            pvVar29 = (void *)((long)pvVar29 + lVar24);
            pvVar31 = (void *)((long)pvVar31 + lVar24);
            pvVar22 = (void *)((long)pvVar22 + lVar24);
            pvVar19 = (void *)((long)pvVar19 + lVar24);
            lVar30 = lVar30 + 0x40;
            lVar27 = lVar27 + 8;
          } while (lVar21 < inch);
        }
        local_180 = local_180 + 1;
        local_158 = (void *)((long)local_158 + 2);
        local_150 = (void *)((long)local_150 + 2);
        local_160 = (void *)((long)local_160 + 2);
        local_178 = (void *)((long)local_178 + 2);
        local_148 = (void *)((long)local_148 + 2);
        local_140 = (void *)((long)local_140 + 2);
        local_138 = (void *)((long)local_138 + 2);
        local_170 = (void *)((long)local_170 + 2);
      } while (local_180 != 0x24);
      uVar20 = local_a8 + 4;
      pvVar22 = (void *)((long)local_80 + local_c0);
      pvVar25 = (void *)((long)local_88 + local_c0);
      pvVar19 = (void *)((long)local_a0 + local_c0);
      pvVar29 = (void *)((long)local_68 + local_c0);
      pvVar31 = (void *)((long)local_70 + local_c0);
      pvVar33 = (void *)((long)local_78 + local_c0);
      pvVar35 = (void *)((long)local_90 + local_c0);
      pvVar40 = (void *)((long)local_98 + local_c0);
    } while (local_a8 + 7 < uVar23);
  }
  if ((int)uVar20 < outch) {
    iVar18 = kernel_tm->w;
    pvVar22 = kernel_tm->data;
    sVar14 = kernel_tm->elemsize;
    sVar15 = kernel_tm->cstep;
    uVar20 = uVar20 & 0xffffffff;
    puVar32 = (undefined2 *)(local_c8 * local_108._16_8_ * uVar20 + local_108._0_8_);
    do {
      lVar24 = 0;
      puVar34 = puVar32;
      do {
        if (7 < inch) {
          lVar30 = (long)pvVar22 +
                   (long)iVar18 * sVar14 * lVar24 +
                   (ulong)(((uint)uVar20 & 3) + ((uint)(uVar20 >> 2) & 0x3fffffff)) *
                   sVar15 * sVar14;
          lVar27 = 0;
          puVar39 = puVar34;
          do {
            lVar36 = 0;
            puVar38 = puVar39;
            do {
              *(undefined2 *)(lVar30 + lVar36) = *puVar38;
              puVar38 = (undefined2 *)
                        ((long)puVar38 + (long)(int)local_108._44_4_ * local_108._16_8_);
              lVar36 = lVar36 + 2;
            } while (lVar36 != 0x10);
            lVar36 = lVar27 + 0xf;
            puVar39 = puVar39 + (long)(int)local_108._44_4_ * local_108._16_8_ * 4;
            lVar30 = lVar30 + 0x10;
            lVar27 = lVar27 + 8;
          } while (lVar36 < inch);
        }
        lVar24 = lVar24 + 1;
        puVar34 = puVar34 + 1;
      } while (lVar24 != 0x24);
      uVar20 = uVar20 + 1;
      puVar32 = (undefined2 *)((long)puVar32 + local_c8 * local_108._16_8_);
    } while (uVar20 != uVar23);
  }
  piVar17 = (int *)CONCAT44(local_108._12_4_,local_108._8_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if ((Allocator *)local_108._32_8_ == (Allocator *)0x0) {
        if ((void *)local_108._0_8_ != (void *)0x0) {
          free((void *)local_108._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_108._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_xop(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(kernel, kernel_tm, inch, outch, opt);
}